

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dr_wav.h
# Opt level: O2

drwav_bool32
drwav_init_write__internal(drwav *pWav,drwav_data_format *pFormat,drwav_uint64 totalSampleCount)

{
  int iVar1;
  drwav_uint64 dVar2;
  drwav_data_format *pdVar3;
  drwav_container dVar4;
  size_t sVar5;
  size_t sVar6;
  size_t sVar7;
  size_t sVar8;
  size_t sVar9;
  size_t sVar10;
  long lVar11;
  long lVar12;
  char *pcVar13;
  ulong uVar14;
  void *pvVar15;
  drwav_uint32 chunkSizeDATA;
  ulong local_58;
  drwav_uint64 local_50;
  drwav_data_format *local_48;
  ulong local_40;
  drwav_uint64 local_38;
  
  if (pWav->isSequentialWrite == 0) {
    dVar4 = pFormat->container;
    local_50 = 0;
  }
  else {
    uVar14 = (pWav->fmt).bitsPerSample * totalSampleCount;
    dVar4 = pFormat->container;
    if (dVar4 == drwav_container_riff && 0x3ffffff6 < uVar14 >> 5) {
      return 0;
    }
    local_50 = uVar14 >> 3;
  }
  pWav->dataChunkDataSizeTargetWrite = local_50;
  local_38 = totalSampleCount;
  if (dVar4 == drwav_container_rf64) {
    sVar5 = (*pWav->onWrite)(pWav->pUserData,"RF64",4);
    local_58 = CONCAT44(local_58._4_4_,0xffffffff);
LAB_00105252:
    sVar7 = 4;
    sVar6 = (*pWav->onWrite)(pWav->pUserData,&local_58,4);
    lVar12 = sVar6 + sVar5;
    pvVar15 = pWav->pUserData;
    pcVar13 = "WAVE";
LAB_0010526d:
    sVar5 = (*pWav->onWrite)(pvVar15,pcVar13,sVar7);
    lVar12 = sVar5 + lVar12;
  }
  else {
    if (dVar4 == drwav_container_w64) {
      uVar14 = local_50 + 0x68;
      sVar7 = 0x10;
      sVar5 = (*pWav->onWrite)(pWav->pUserData,drwavGUID_W64_RIFF,0x10);
      local_58 = uVar14;
      sVar6 = (*pWav->onWrite)(pWav->pUserData,&local_58,8);
      lVar12 = sVar6 + sVar5;
      pvVar15 = pWav->pUserData;
      pcVar13 = (char *)drwavGUID_W64_WAVE;
      goto LAB_0010526d;
    }
    if (dVar4 == drwav_container_riff) {
      iVar1 = (int)local_50;
      sVar5 = (*pWav->onWrite)(pWav->pUserData,"RIFF",4);
      local_58 = CONCAT44(local_58._4_4_,iVar1 + 0x1c);
      goto LAB_00105252;
    }
    lVar12 = 0;
  }
  dVar2 = local_50;
  dVar4 = pFormat->container;
  local_48 = pFormat;
  if (dVar4 == drwav_container_rf64) {
    local_40 = local_50 + 0x24;
    sVar5 = (*pWav->onWrite)(pWav->pUserData,"ds64",4);
    local_58 = CONCAT44(local_58._4_4_,0x1c);
    sVar7 = (*pWav->onWrite)(pWav->pUserData,&local_58,4);
    local_58 = local_40;
    sVar6 = (*pWav->onWrite)(pWav->pUserData,&local_58,8);
    local_58 = dVar2;
    sVar8 = (*pWav->onWrite)(pWav->pUserData,&local_58,8);
    local_58 = local_38;
    sVar9 = (*pWav->onWrite)(pWav->pUserData,&local_58,8);
    local_58 = local_58 & 0xffffffff00000000;
    sVar10 = (*pWav->onWrite)(pWav->pUserData,&local_58,4);
    lVar12 = sVar10 + sVar9 + sVar8 + sVar6 + sVar7 + sVar5 + lVar12;
    dVar4 = local_48->container;
  }
  if (dVar4 == drwav_container_rf64) {
LAB_0010535d:
    sVar5 = (*pWav->onWrite)(pWav->pUserData,"fmt ",4);
    local_58 = CONCAT44(local_58._4_4_,0x10);
    sVar7 = (*pWav->onWrite)(pWav->pUserData,&local_58,4);
    lVar11 = sVar7 + sVar5;
LAB_001053b8:
    lVar12 = lVar12 + lVar11;
  }
  else {
    if (dVar4 == drwav_container_w64) {
      sVar5 = (*pWav->onWrite)(pWav->pUserData,drwavGUID_W64_FMT,0x10);
      local_58 = 0x28;
      sVar7 = (*pWav->onWrite)(pWav->pUserData,&local_58,8);
      lVar11 = sVar7 + sVar5;
      goto LAB_001053b8;
    }
    if (dVar4 == drwav_container_riff) goto LAB_0010535d;
  }
  local_58._0_2_ = (pWav->fmt).formatTag;
  sVar5 = (*pWav->onWrite)(pWav->pUserData,&local_58,2);
  local_58 = CONCAT62(local_58._2_6_,(pWav->fmt).channels);
  sVar7 = (*pWav->onWrite)(pWav->pUserData,&local_58,2);
  local_58._0_4_ = (pWav->fmt).sampleRate;
  sVar6 = (*pWav->onWrite)(pWav->pUserData,&local_58,4);
  local_58 = CONCAT44(local_58._4_4_,(pWav->fmt).avgBytesPerSec);
  sVar8 = (*pWav->onWrite)(pWav->pUserData,&local_58,4);
  local_58._0_2_ = (pWav->fmt).blockAlign;
  sVar9 = (*pWav->onWrite)(pWav->pUserData,&local_58,2);
  local_58 = CONCAT62(local_58._2_6_,(pWav->fmt).bitsPerSample);
  sVar10 = (*pWav->onWrite)(pWav->pUserData,&local_58,2);
  pdVar3 = local_48;
  dVar2 = local_50;
  pWav->dataChunkDataPos = sVar10 + sVar9 + sVar8 + sVar6 + sVar7 + sVar5 + lVar12;
  dVar4 = local_48->container;
  if (dVar4 == drwav_container_rf64) {
    (*pWav->onWrite)(pWav->pUserData,"data",4);
    local_58 = CONCAT44(local_58._4_4_,0xffffffff);
LAB_001054f7:
    sVar5 = 4;
    pvVar15 = pWav->pUserData;
  }
  else {
    if (dVar4 != drwav_container_w64) {
      if (dVar4 != drwav_container_riff) goto LAB_00105501;
      (*pWav->onWrite)(pWav->pUserData,"data",4);
      local_58 = CONCAT44(local_58._4_4_,(int)dVar2);
      goto LAB_001054f7;
    }
    uVar14 = local_50 + 0x18;
    (*pWav->onWrite)(pWav->pUserData,drwavGUID_W64_DATA,0x10);
    pvVar15 = pWav->pUserData;
    sVar5 = 8;
    local_58 = uVar14;
  }
  (*pWav->onWrite)(pvVar15,&local_58,sVar5);
LAB_00105501:
  pWav->container = pdVar3->container;
  pWav->channels = (drwav_uint16)pdVar3->channels;
  pWav->sampleRate = pdVar3->sampleRate;
  pWav->bitsPerSample = (drwav_uint16)pdVar3->bitsPerSample;
  pWav->translatedFormatTag = (drwav_uint16)pdVar3->format;
  return 1;
}

Assistant:

static drwav_bool32 drwav_init_write__internal(drwav* pWav, const drwav_data_format* pFormat, drwav_uint64 totalSampleCount)
{
    /* The function assumes drwav_preinit_write() was called beforehand. */

    size_t runningPos = 0;
    drwav_uint64 initialDataChunkSize = 0;
    drwav_uint64 chunkSizeFMT;

    /*
    The initial values for the "RIFF" and "data" chunks depends on whether or not we are initializing in sequential mode or not. In
    sequential mode we set this to its final values straight away since they can be calculated from the total sample count. In non-
    sequential mode we initialize it all to zero and fill it out in drwav_uninit() using a backwards seek.
    */
    if (pWav->isSequentialWrite) {
        initialDataChunkSize = (totalSampleCount * pWav->fmt.bitsPerSample) / 8;

        /*
        The RIFF container has a limit on the number of samples. drwav is not allowing this. There's no practical limits for Wave64
        so for the sake of simplicity I'm not doing any validation for that.
        */
        if (pFormat->container == drwav_container_riff) {
            if (initialDataChunkSize > (0xFFFFFFFFUL - 36)) {
                return DRWAV_FALSE; /* Not enough room to store every sample. */
            }
        }
    }

    pWav->dataChunkDataSizeTargetWrite = initialDataChunkSize;


    /* "RIFF" chunk. */
    if (pFormat->container == drwav_container_riff) {
        drwav_uint32 chunkSizeRIFF = 28 + (drwav_uint32)initialDataChunkSize;   /* +28 = "WAVE" + [sizeof "fmt " chunk] */
        runningPos += drwav__write(pWav, "RIFF", 4);
        runningPos += drwav__write_u32ne_to_le(pWav, chunkSizeRIFF);
        runningPos += drwav__write(pWav, "WAVE", 4);
    } else if (pFormat->container == drwav_container_w64) {
        drwav_uint64 chunkSizeRIFF = 80 + 24 + initialDataChunkSize;            /* +24 because W64 includes the size of the GUID and size fields. */
        runningPos += drwav__write(pWav, drwavGUID_W64_RIFF, 16);
        runningPos += drwav__write_u64ne_to_le(pWav, chunkSizeRIFF);
        runningPos += drwav__write(pWav, drwavGUID_W64_WAVE, 16);
    } else if (pFormat->container == drwav_container_rf64) {
        runningPos += drwav__write(pWav, "RF64", 4);
        runningPos += drwav__write_u32ne_to_le(pWav, 0xFFFFFFFF);               /* Always 0xFFFFFFFF for RF64. Set to a proper value in the "ds64" chunk. */
        runningPos += drwav__write(pWav, "WAVE", 4);
    }

    
    /* "ds64" chunk (RF64 only). */
    if (pFormat->container == drwav_container_rf64) {
        drwav_uint32 initialds64ChunkSize = 28;                                 /* 28 = [Size of RIFF (8 bytes)] + [Size of DATA (8 bytes)] + [Sample Count (8 bytes)] + [Table Length (4 bytes)]. Table length always set to 0. */
        drwav_uint64 initialRiffChunkSize = 8 + initialds64ChunkSize + initialDataChunkSize;    /* +8 for the ds64 header. */

        runningPos += drwav__write(pWav, "ds64", 4);
        runningPos += drwav__write_u32ne_to_le(pWav, initialds64ChunkSize);     /* Size of ds64. */
        runningPos += drwav__write_u64ne_to_le(pWav, initialRiffChunkSize);     /* Size of RIFF. Set to true value at the end. */
        runningPos += drwav__write_u64ne_to_le(pWav, initialDataChunkSize);     /* Size of DATA. Set to true value at the end. */
        runningPos += drwav__write_u64ne_to_le(pWav, totalSampleCount);         /* Sample count. */
        runningPos += drwav__write_u32ne_to_le(pWav, 0);                        /* Table length. Always set to zero in our case since we're not doing any other chunks than "DATA". */
    }


    /* "fmt " chunk. */
    if (pFormat->container == drwav_container_riff || pFormat->container == drwav_container_rf64) {
        chunkSizeFMT = 16;
        runningPos += drwav__write(pWav, "fmt ", 4);
        runningPos += drwav__write_u32ne_to_le(pWav, (drwav_uint32)chunkSizeFMT);
    } else if (pFormat->container == drwav_container_w64) {
        chunkSizeFMT = 40;
        runningPos += drwav__write(pWav, drwavGUID_W64_FMT, 16);
        runningPos += drwav__write_u64ne_to_le(pWav, chunkSizeFMT);
    }

    runningPos += drwav__write_u16ne_to_le(pWav, pWav->fmt.formatTag);
    runningPos += drwav__write_u16ne_to_le(pWav, pWav->fmt.channels);
    runningPos += drwav__write_u32ne_to_le(pWav, pWav->fmt.sampleRate);
    runningPos += drwav__write_u32ne_to_le(pWav, pWav->fmt.avgBytesPerSec);
    runningPos += drwav__write_u16ne_to_le(pWav, pWav->fmt.blockAlign);
    runningPos += drwav__write_u16ne_to_le(pWav, pWav->fmt.bitsPerSample);

    pWav->dataChunkDataPos = runningPos;

    /* "data" chunk. */
    if (pFormat->container == drwav_container_riff) {
        drwav_uint32 chunkSizeDATA = (drwav_uint32)initialDataChunkSize;
        runningPos += drwav__write(pWav, "data", 4);
        runningPos += drwav__write_u32ne_to_le(pWav, chunkSizeDATA);
    } else if (pFormat->container == drwav_container_w64) {
        drwav_uint64 chunkSizeDATA = 24 + initialDataChunkSize;     /* +24 because W64 includes the size of the GUID and size fields. */
        runningPos += drwav__write(pWav, drwavGUID_W64_DATA, 16);
        runningPos += drwav__write_u64ne_to_le(pWav, chunkSizeDATA);
    } else if (pFormat->container == drwav_container_rf64) {
        runningPos += drwav__write(pWav, "data", 4);
        runningPos += drwav__write_u32ne_to_le(pWav, 0xFFFFFFFF);   /* Always set to 0xFFFFFFFF for RF64. The true size of the data chunk is specified in the ds64 chunk. */
    }

    /*
    The runningPos variable is incremented in the section above but is left unused which is causing some static analysis tools to detect it
    as a dead store. I'm leaving this as-is for safety just in case I want to expand this function later to include other tags and want to
    keep track of the running position for whatever reason. The line below should silence the static analysis tools.
    */
    (void)runningPos;

    /* Set some properties for the client's convenience. */
    pWav->container = pFormat->container;
    pWav->channels = (drwav_uint16)pFormat->channels;
    pWav->sampleRate = pFormat->sampleRate;
    pWav->bitsPerSample = (drwav_uint16)pFormat->bitsPerSample;
    pWav->translatedFormatTag = (drwav_uint16)pFormat->format;

    return DRWAV_TRUE;
}